

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Forel.cpp
# Opt level: O3

Point * __thiscall
Forel::mass_centre(Point *__return_storage_ptr__,Forel *this,
                  vector<Point,_std::allocator<Point>_> *points,
                  vector<int,_std::allocator<int>_> *inside_circle)

{
  double *pdVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  double in_XMM1_Qa;
  double in_XMM1_Qb;
  
  piVar2 = (inside_circle->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(inside_circle->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  if (0 < (int)uVar3) {
    uVar4 = 0;
    do {
      pdVar1 = &(points->super__Vector_base<Point,_std::allocator<Point>_>)._M_impl.
                super__Vector_impl_data._M_start[piVar2[uVar4]].x;
      in_XMM1_Qa = in_XMM1_Qa + *pdVar1;
      in_XMM1_Qb = in_XMM1_Qb + pdVar1[1];
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  Point::Point(__return_storage_ptr__,in_XMM1_Qa / (double)(int)uVar3,
               in_XMM1_Qb / (double)(int)uVar3);
  return __return_storage_ptr__;
}

Assistant:

Point Forel::mass_centre(vector<Point> points, vector<int> inside_circle) {
    double x, y;
    for (int i = 0; i < (int) inside_circle.size(); i++) {
        x += points[inside_circle[i]].x;
        y += points[inside_circle[i]].y;

    }
    x = x / (int) inside_circle.size();
    y = y / (int) inside_circle.size();
    return Point(x, y);
}